

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonObject.cpp
# Opt level: O0

void __thiscall json::JsonObject::JsonObject(JsonObject *this)

{
  JsonObject *this_local;
  
  JsonNode::JsonNode(&this->super_JsonNode);
  (this->super_JsonNode)._vptr_JsonNode = (_func_int **)&PTR__JsonObject_001279f8;
  this->childCounter = 0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json::JsonObject::Value>_>_>
  ::unordered_map(&this->children);
  return;
}

Assistant:

JsonObject::JsonObject() : JsonNode(), childCounter(0)
    {
    }